

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::OptionException::~OptionException(OptionException *this)

{
  *(undefined ***)this = &PTR__OptionException_001383b8;
  std::__cxx11::string::~string((string *)&this->m_message);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

OptionException(const std::string& message)
    : m_message(message)
    {
    }